

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.h
# Opt level: O0

void __thiscall jaegertracing::net::http::Header::Header(Header *this,string *key,string *value)

{
  string *value_local;
  string *key_local;
  Header *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  std::__cxx11::string::string((string *)&this->_value,(string *)value);
  return;
}

Assistant:

Header(const std::string& key, const std::string& value)
        : _key(key)
        , _value(value)
    {
    }